

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O3

ExpressionValue *
expFuncToHex(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
            vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  bool bVar1;
  long *args_1;
  int64_t digits;
  int64_t value;
  int64_t local_68;
  int64_t local_60;
  StringLiteral local_58;
  string local_38;
  
  bVar1 = getExpFuncParameter(parameters,0,&local_60,funcName,false);
  if (bVar1) {
    local_68 = 8;
    args_1 = (long *)0x1;
    bVar1 = getExpFuncParameter(parameters,1,&local_68,funcName,true);
    if (bVar1) {
      tinyformat::format<long,long>
                (&local_38,(tinyformat *)"%0*X",(char *)&local_68,&local_60,args_1);
      StringLiteral::StringLiteral(&local_58,&local_38);
      __return_storage_ptr__->type = String;
      (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->strValue,local_58._value._M_dataplus._M_p,
                 local_58._value._M_dataplus._M_p + local_58._value._M_string_length);
      (__return_storage_ptr__->field_1).intValue = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._value._M_dataplus._M_p != &local_58._value.field_2) {
        operator_delete(local_58._value._M_dataplus._M_p,
                        local_58._value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncToHex(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	int64_t value, digits;
	GET_PARAM(parameters,0,value);
	GET_OPTIONAL_PARAM(parameters,1,digits,8);

	return ExpressionValue(tfm::format("%0*X",digits,value));
}